

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_table_scan_profile_avx2_256_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  undefined1 (*pauVar1) [24];
  undefined8 *puVar2;
  __m256i alVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  int *piVar7;
  undefined1 auVar8 [32];
  int iVar9;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i a_05;
  __m256i a_06;
  __m256i a_07;
  __m256i a_08;
  __m256i a_09;
  __m256i a_10;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  __m256i b_05;
  __m256i b_06;
  __m256i b_07;
  __m256i b_08;
  __m256i b_09;
  __m256i b_10;
  __m256i b_11;
  size_t size;
  long lVar10;
  undefined1 auVar11 [24];
  uint uVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m256i *ptr;
  int64_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  ulong uVar15;
  __m256i *palVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  __m256i *palVar21;
  char *pcVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  __m256i *__return_storage_ptr__;
  long lVar26;
  char *__format;
  long lVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  undefined8 uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  __m256i_64_t e;
  __m256i_64_t h;
  undefined1 in_stack_fffffffffffffca0 [20];
  uint uVar46;
  undefined4 uVar47;
  __m256i *palVar48;
  __m256i local_320;
  long local_2b8;
  int local_2b0;
  undefined1 local_2a0 [32];
  undefined1 local_220 [32];
  long local_200;
  long lStack_1f8;
  long lStack_1f0;
  long lStack_1e8;
  longlong local_a0 [4];
  longlong local_80 [10];
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar22 = "profile";
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar22 = "profile->profile64.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar22 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar22 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar22 = "s2";
        }
        else {
          uVar30 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar22 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar22 = "open";
          }
          else {
            if (-1 < gap) {
              uVar35 = uVar4 - 1;
              uVar25 = (ulong)uVar4 + 3 >> 2;
              uVar46 = (uint)uVar25;
              uVar47 = 0;
              uVar31 = CONCAT44(0,open);
              iVar17 = -open;
              iVar19 = ppVar6->min;
              uVar33 = 0x8000000000000000 - (long)iVar19;
              if (iVar19 != iVar17 && SBORROW4(iVar19,iVar17) == iVar19 + open < 0) {
                uVar33 = uVar31 | 0x8000000000000000;
              }
              iVar19 = ppVar6->max;
              ppVar14 = parasail_result_new_table1((uint)((ulong)uVar4 + 3) & 0x7ffffffc,s2Len);
              if (ppVar14 != (parasail_result_t *)0x0) {
                ppVar14->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar14->flag |
                     0x4820402;
                size = CONCAT44(uVar47,uVar46);
                ptr = parasail_memalign___m256i(0x20,size);
                __return_storage_ptr__ = (__m256i *)(ulong)(s2Len + 1);
                ptr_00 = parasail_memalign_int64_t(0x20,(size_t)__return_storage_ptr__);
                ptr_01 = parasail_memalign___m256i(0x20,size);
                ptr_02 = parasail_memalign___m256i(0x20,size);
                ptr_03 = parasail_memalign___m256i(0x20,size);
                if (ptr_03 != (__m256i *)0x0 &&
                    ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                    (ptr_00 != (int64_t *)0x0 && ptr != (__m256i *)0x0))) {
                  iVar13 = s2Len + -1;
                  iVar9 = -(int)(uVar35 / uVar25);
                  iVar18 = iVar9 + 3;
                  auVar43._8_4_ = open;
                  auVar43._0_8_ = uVar31;
                  auVar43._12_4_ = 0;
                  auVar43._16_4_ = open;
                  auVar43._20_4_ = 0;
                  auVar43._24_4_ = open;
                  auVar43._28_4_ = 0;
                  uVar15 = CONCAT44(0,gap);
                  auVar38._8_4_ = gap;
                  auVar38._0_8_ = uVar15;
                  auVar38._12_4_ = 0;
                  auVar38._16_4_ = gap;
                  auVar38._20_4_ = 0;
                  auVar38._24_4_ = gap;
                  auVar38._28_4_ = 0;
                  uVar33 = uVar33 + 1;
                  lVar23 = 0x7ffffffffffffffe - (long)iVar19;
                  lVar10 = CONCAT44(uVar47,uVar46);
                  lVar20 = (long)(int)-(uVar46 * gap);
                  auVar39._8_8_ = lVar20;
                  auVar39._0_8_ = lVar20;
                  auVar39._16_8_ = lVar20;
                  auVar39._24_8_ = lVar20;
                  auVar39 = vpblendd_avx2(auVar39,SUB6432(ZEXT1664((undefined1  [16])0x0),0),3);
                  auVar39 = vpaddq_avx2(ZEXT832(uVar33),auVar39);
                  lVar20 = (long)iVar17;
                  for (lVar26 = 0; lVar26 != lVar10; lVar26 = lVar26 + 1) {
                    lVar27 = lVar20;
                    for (lVar28 = 0; lVar28 != 4; lVar28 = lVar28 + 1) {
                      lVar29 = lVar27;
                      if (s1_beg != 0) {
                        lVar29 = 0;
                      }
                      local_80[lVar28] = lVar29;
                      local_a0[lVar28] = lVar29 - uVar31;
                      lVar27 = lVar27 - lVar10 * uVar15;
                    }
                    palVar16 = ptr_02 + lVar26;
                    (*palVar16)[0] = local_80[0];
                    (*palVar16)[1] = local_80[1];
                    (*palVar16)[2] = local_80[2];
                    (*palVar16)[3] = local_80[3];
                    palVar16 = ptr + lVar26;
                    (*palVar16)[0] = local_a0[0];
                    (*palVar16)[1] = local_a0[1];
                    (*palVar16)[2] = local_a0[2];
                    (*palVar16)[3] = local_a0[3];
                    lVar20 = lVar20 - uVar15;
                  }
                  *ptr_00 = 0;
                  for (palVar16 = (__m256i *)0x1; __return_storage_ptr__ != palVar16;
                      palVar16 = (__m256i *)((long)*palVar16 + 1)) {
                    iVar19 = 0;
                    if (s2_beg == 0) {
                      iVar19 = iVar17;
                    }
                    ptr_00[(long)palVar16] = (long)iVar19;
                    iVar17 = iVar17 - gap;
                  }
                  local_320 = (__m256i)vpsubq_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),
                                                   auVar43);
                  uVar24 = uVar46 - 1;
                  local_200 = lVar23;
                  lStack_1f8 = lVar23;
                  lStack_1f0 = lVar23;
                  lStack_1e8 = lVar23;
                  for (uVar34 = uVar24; -1 < (int)uVar34; uVar34 = uVar34 - 1) {
                    ptr_03[uVar34] = local_320;
                    local_320 = (__m256i)vpsubq_avx2((undefined1  [32])local_320,auVar38);
                    alVar3[2]._4_4_ = iVar13;
                    alVar3._0_20_ = in_stack_fffffffffffffca0;
                    alVar3[3] = (longlong)ptr_00;
                    b[1] = (longlong)ptr_03;
                    b[0] = (longlong)ptr_02;
                    b[2]._0_4_ = uVar46;
                    b[2]._4_4_ = uVar47;
                    b[3] = (longlong)ptr;
                    _mm256_min_epi64_rpl(__return_storage_ptr__,alVar3,b);
                  }
                  palVar16 = ptr_02 + uVar24;
                  palVar21 = ptr_02 + (ulong)uVar35 % uVar25;
                  lVar20 = lVar10 * uVar30;
                  local_2b8 = 0;
                  local_220._8_8_ = uVar33;
                  local_220._0_8_ = uVar33;
                  local_220._16_8_ = uVar33;
                  local_220._24_8_ = uVar33;
                  auVar44 = ZEXT3264(local_220);
                  uVar25 = 0;
                  iVar19 = iVar13;
                  while (uVar25 != uVar30) {
                    auVar40 = auVar44._0_32_;
                    alVar3 = *palVar16;
                    auVar37 = alVar3._0_16_;
                    auVar45._0_16_ = ZEXT116(0) * auVar37 + ZEXT116(1) * auVar37;
                    auVar45._16_16_ = ZEXT116(0) * alVar3._16_16_ + ZEXT116(1) * auVar37;
                    auVar45 = vpalignr_avx2((undefined1  [32])alVar3,auVar45,8);
                    auVar8 = vpblendd_avx2(auVar45,ZEXT832((ulong)ptr_00[uVar25]),3);
                    iVar17 = ppVar6->mapper[(byte)s2[uVar25]] * uVar46;
                    local_2a0._8_8_ = uVar33;
                    local_2a0._0_8_ = uVar33;
                    local_2a0._16_8_ = uVar33;
                    local_2a0._24_8_ = uVar33;
                    auVar45 = vpsubq_avx2(local_2a0,(undefined1  [32])*ptr_03);
                    for (lVar26 = 0; lVar10 << 5 != lVar26; lVar26 = lVar26 + 0x20) {
                      auVar42 = *(undefined1 (*) [32])((long)*ptr_02 + lVar26);
                      auVar41 = vpsubq_avx2(*(undefined1 (*) [32])((long)*ptr + lVar26),auVar38);
                      vpsubq_avx2(auVar42,auVar43);
                      vpaddq_avx2(auVar8,*(undefined1 (*) [32])
                                          ((long)pvVar5 + lVar26 + (long)iVar17 * 0x20));
                      a[2]._4_4_ = iVar19;
                      a._0_20_ = in_stack_fffffffffffffca0;
                      a[3] = (longlong)ptr_00;
                      b_00[1] = (longlong)ptr_03;
                      b_00[0] = (longlong)ptr_02;
                      b_00[2]._0_4_ = uVar46;
                      b_00[2]._4_4_ = uVar47;
                      b_00[3] = (longlong)ptr;
                      palVar48 = ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a,b_00);
                      vpaddq_avx2(auVar45,*(undefined1 (*) [32])((long)*ptr_03 + lVar26));
                      a_00[2]._4_4_ = iVar19;
                      a_00._0_20_ = in_stack_fffffffffffffca0;
                      a_00[3] = (longlong)ptr_00;
                      b_01[1] = (longlong)ptr_03;
                      b_01[0] = (longlong)ptr_02;
                      b_01[2]._0_4_ = uVar46;
                      b_01[2]._4_4_ = uVar47;
                      b_01[3] = (longlong)palVar48;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_01);
                      a_01[2]._4_4_ = iVar19;
                      a_01._0_20_ = in_stack_fffffffffffffca0;
                      a_01[3] = (longlong)ptr_00;
                      b_02[1] = (longlong)ptr_03;
                      b_02[0] = (longlong)ptr_02;
                      b_02[2]._0_4_ = uVar46;
                      b_02[2]._4_4_ = uVar47;
                      b_02[3] = (longlong)palVar48;
                      auVar45 = auVar41;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_02);
                      local_320[0] = auVar41._0_8_;
                      local_320[1] = auVar41._8_8_;
                      local_320[2] = auVar41._16_8_;
                      local_320[3] = auVar41._24_8_;
                      puVar2 = (undefined8 *)((long)*ptr + lVar26);
                      *puVar2 = local_320[0];
                      puVar2[1] = local_320[1];
                      puVar2[2] = local_320[2];
                      puVar2[3] = local_320[3];
                      *(undefined1 (*) [32])((long)*ptr_01 + lVar26) = auVar45;
                      auVar8 = auVar42;
                      ptr = palVar48;
                    }
                    auVar45 = vpermq_avx2(auVar45,0x90);
                    auVar45 = vpblendd_avx2(auVar45,ZEXT832((ulong)ptr_00[uVar25 + 1]),3);
                    vpaddq_avx2(auVar45,(undefined1  [32])*ptr_03);
                    auVar44 = ZEXT3264(local_2a0);
                    a_02[2]._4_4_ = iVar19;
                    a_02._0_20_ = in_stack_fffffffffffffca0;
                    a_02[3] = (longlong)ptr_00;
                    b_03[1] = (longlong)ptr_03;
                    b_03[0] = (longlong)ptr_02;
                    b_03[2]._0_4_ = uVar46;
                    b_03[2]._4_4_ = uVar47;
                    b_03[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_03);
                    iVar17 = 2;
                    while( true ) {
                      auVar42 = auVar44._0_32_;
                      auVar8 = vperm2i128_avx2(auVar42,auVar42,8);
                      auVar8 = vpalignr_avx2(auVar42,auVar8,8);
                      bVar36 = iVar17 == 0;
                      iVar17 = iVar17 + -1;
                      if (bVar36) break;
                      vpaddq_avx2(auVar8,auVar39);
                      a_03[2]._4_4_ = iVar19;
                      a_03._0_20_ = in_stack_fffffffffffffca0;
                      a_03[3] = (longlong)ptr_00;
                      b_04[1] = (longlong)ptr_03;
                      b_04[0] = (longlong)ptr_02;
                      b_04[2]._0_4_ = uVar46;
                      b_04[2]._4_4_ = uVar47;
                      b_04[3] = (longlong)ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_04);
                    }
                    local_320 = (__m256i)vpaddq_avx2(auVar8,ZEXT832(uVar33));
                    a_04[2]._4_4_ = iVar19;
                    a_04._0_20_ = in_stack_fffffffffffffca0;
                    a_04[3] = (longlong)ptr_00;
                    b_05[1] = (longlong)ptr_03;
                    b_05[0] = (longlong)ptr_02;
                    b_05[2]._0_4_ = uVar46;
                    b_05[2]._4_4_ = uVar47;
                    b_05[3] = (longlong)ptr;
                    local_2a0 = auVar45;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_05);
                    lVar26 = local_2b8;
                    for (lVar27 = 0; lVar10 << 5 != lVar27; lVar27 = lVar27 + 0x20) {
                      pauVar1 = (undefined1 (*) [24])((long)*ptr_01 + lVar27);
                      auVar11 = *pauVar1;
                      uVar32 = *(undefined8 *)pauVar1[1];
                      local_320 = (__m256i)vpsubq_avx2((undefined1  [32])local_320,auVar38);
                      vpsubq_avx2(local_2a0,auVar43);
                      a_05[2]._4_4_ = iVar19;
                      a_05._0_20_ = in_stack_fffffffffffffca0;
                      a_05[3] = (longlong)ptr_00;
                      b_06[1] = (longlong)ptr_03;
                      b_06[0] = (longlong)ptr_02;
                      b_06[2]._0_4_ = uVar46;
                      b_06[2]._4_4_ = uVar47;
                      b_06[3] = (longlong)ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_05,b_06);
                      local_2a0._0_8_ = auVar11._0_8_;
                      local_2a0._8_8_ = auVar11._8_8_;
                      local_2a0._16_8_ = auVar11._16_8_;
                      a_06[2]._4_4_ = iVar19;
                      a_06._0_20_ = in_stack_fffffffffffffca0;
                      a_06[3] = (longlong)ptr_00;
                      b_07[1] = (longlong)ptr_03;
                      b_07[0] = (longlong)ptr_02;
                      b_07[2]._0_4_ = uVar46;
                      b_07[2]._4_4_ = uVar47;
                      b_07[3] = (longlong)ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_06,b_07);
                      local_2a0._24_8_ = uVar32;
                      puVar2 = (undefined8 *)((long)*ptr_02 + lVar27);
                      *puVar2 = local_2a0._0_8_;
                      puVar2[1] = local_2a0._8_8_;
                      puVar2[2] = local_2a0._16_8_;
                      puVar2[3] = uVar32;
                      a_07[2]._4_4_ = iVar19;
                      a_07._0_20_ = in_stack_fffffffffffffca0;
                      a_07[3] = (longlong)ptr_00;
                      b_08[1] = (longlong)ptr_03;
                      b_08[0] = (longlong)ptr_02;
                      b_08[2]._0_4_ = uVar46;
                      b_08[2]._4_4_ = uVar47;
                      b_08[3] = (longlong)ptr;
                      _mm256_min_epi64_rpl(__return_storage_ptr__,a_07,b_08);
                      a_08[2]._4_4_ = iVar19;
                      a_08._0_20_ = in_stack_fffffffffffffca0;
                      a_08[3] = (longlong)ptr_00;
                      b_09[1] = (longlong)ptr_03;
                      b_09[0] = (longlong)ptr_02;
                      b_09[2]._0_4_ = uVar46;
                      b_09[2]._4_4_ = uVar47;
                      b_09[3] = (longlong)ptr;
                      _mm256_min_epi64_rpl(__return_storage_ptr__,a_08,b_09);
                      a_09[2]._4_4_ = iVar19;
                      a_09._0_20_ = in_stack_fffffffffffffca0;
                      a_09[3] = (longlong)ptr_00;
                      b_10[1] = (longlong)ptr_03;
                      b_10[0] = (longlong)ptr_02;
                      b_10[2]._0_4_ = uVar46;
                      b_10[2]._4_4_ = uVar47;
                      b_10[3] = (longlong)ptr;
                      _mm256_max_epi64_rpl(__return_storage_ptr__,a_09,b_10);
                      piVar7 = ((ppVar14->field_4).rowcols)->score_row;
                      *(int *)((long)piVar7 + lVar26) = (int)local_2a0._0_8_;
                      *(int *)((long)piVar7 + lVar20 * 4 + lVar26) = (int)local_2a0._8_8_;
                      *(int *)((long)piVar7 + lVar20 * 8 + lVar26) = (int)local_2a0._16_8_;
                      *(int *)((long)piVar7 + lVar20 * 0xc + lVar26) = (int)uVar32;
                      lVar26 = lVar26 + uVar30 * 4;
                    }
                    alVar3 = *palVar21;
                    auVar44 = ZEXT3264((undefined1  [32])alVar3);
                    auVar45 = vpcmpgtq_avx2((undefined1  [32])alVar3,auVar40);
                    a_10[2]._4_4_ = iVar19;
                    a_10._0_20_ = in_stack_fffffffffffffca0;
                    a_10[3] = (longlong)ptr_00;
                    b_11[1] = (longlong)ptr_03;
                    b_11[0] = (longlong)ptr_02;
                    b_11[2]._0_4_ = uVar46;
                    b_11[2]._4_4_ = uVar47;
                    b_11[3] = (longlong)ptr;
                    _mm256_max_epi64_rpl(__return_storage_ptr__,a_10,b_11);
                    auVar8._8_8_ = -(ulong)(iVar18 == 2);
                    auVar8._0_8_ = -(ulong)(iVar18 == 3);
                    auVar8._16_8_ = -(ulong)(iVar18 == 1);
                    auVar8._24_8_ = -(ulong)(iVar9 == -3);
                    auVar8 = auVar8 & auVar45;
                    local_2b0 = (int)uVar25;
                    if ((((auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         SUB321(auVar8 >> 0x7f,0) != '\0') || SUB321(auVar8 >> 0xbf,0) != '\0') ||
                        auVar8[0x1f] < '\0') {
                      iVar13 = local_2b0;
                    }
                    local_2b8 = local_2b8 + 4;
                    uVar25 = uVar25 + 1;
                  }
                  uVar30 = uVar33;
                  if (s2_end != 0) {
                    for (iVar17 = 0; iVar17 < iVar18; iVar17 = iVar17 + 1) {
                      auVar43 = auVar44._0_32_;
                      auVar39 = vperm2i128_avx2(auVar43,auVar43,8);
                      auVar39 = vpalignr_avx2(auVar43,auVar39,8);
                      auVar44 = ZEXT3264(auVar39);
                    }
                    uVar30 = vpextrq_avx(auVar44._16_16_,1);
                  }
                  uVar34 = uVar35;
                  if (s1_end != 0) {
                    for (uVar25 = 0; (uVar46 & 0x1fffffff) << 2 != (uint)uVar25; uVar25 = uVar25 + 1
                        ) {
                      uVar24 = ((uint)uVar25 & 3) * uVar46 + ((uint)(uVar25 >> 2) & 0x3fffffff);
                      uVar31 = uVar30;
                      iVar17 = iVar13;
                      uVar12 = uVar34;
                      if (((int)uVar24 < (int)uVar4) &&
                         (uVar31 = (*ptr_02)[uVar25], iVar17 = iVar19, uVar12 = uVar24,
                         (long)uVar31 <= (long)uVar30)) {
                        if ((int)uVar34 <= (int)uVar24) {
                          uVar24 = uVar34;
                        }
                        if (iVar13 != iVar19) {
                          uVar24 = uVar34;
                        }
                        bVar36 = uVar31 == uVar30;
                        uVar31 = uVar30;
                        iVar17 = iVar13;
                        uVar12 = uVar34;
                        if (bVar36) {
                          uVar12 = uVar24;
                        }
                      }
                      uVar34 = uVar12;
                      iVar13 = iVar17;
                      uVar30 = uVar31;
                    }
                  }
                  iVar17 = (int)uVar30;
                  if (s2_end == 0 && s1_end == 0) {
                    alVar3 = *palVar21;
                    for (iVar17 = 0; iVar17 < iVar18; iVar17 = iVar17 + 1) {
                      auVar39 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,8)
                      ;
                      alVar3 = (__m256i)vpalignr_avx2((undefined1  [32])alVar3,auVar39,8);
                    }
                    uVar32 = vpextrq_avx(alVar3._16_16_,1);
                    iVar17 = (int)uVar32;
                    iVar13 = iVar19;
                    uVar34 = uVar35;
                  }
                  auVar42._8_8_ = uVar33;
                  auVar42._0_8_ = uVar33;
                  auVar42._16_8_ = uVar33;
                  auVar42._24_8_ = uVar33;
                  auVar40._8_8_ = lStack_1f8;
                  auVar40._0_8_ = local_200;
                  auVar40._16_8_ = lStack_1f0;
                  auVar40._24_8_ = lStack_1e8;
                  auVar39 = vpcmpgtq_avx2(auVar42,auVar40);
                  auVar41._8_8_ = lVar23;
                  auVar41._0_8_ = lVar23;
                  auVar41._16_8_ = lVar23;
                  auVar41._24_8_ = lVar23;
                  auVar43 = vpcmpgtq_avx2(local_220,auVar41);
                  auVar39 = vpor_avx2(auVar43,auVar39);
                  if ((((auVar39 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       SUB321(auVar39 >> 0x7f,0) != '\0') || SUB321(auVar39 >> 0xbf,0) != '\0') ||
                      auVar39[0x1f] < '\0') {
                    *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                    iVar17 = 0;
                    iVar13 = 0;
                    uVar34 = 0;
                  }
                  ppVar14->score = iVar17;
                  ppVar14->end_query = uVar34;
                  ppVar14->end_ref = iVar13;
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  return ppVar14;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar22 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_table_scan_profile_avx2_256_64",pcVar22);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int64_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m256i vZero;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vPosMask;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile64.score;
    vGapO = _mm256_set1_epi64x_rpl(open);
    vGapE = _mm256_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm256_cmpeq_epi64(_mm256_set1_epi64x_rpl(position),
            _mm256_set_epi64x_rpl(0,1,2,3));
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi64(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int64_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_64_t h;
            __m256i_64_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi64(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi64(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 8);
        vHp = _mm256_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vE, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vHp = _mm256_add_epi64(vHp, vW);
            vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[i]));
            vHt = _mm256_max_epi64_rpl(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 8);
        vHt = _mm256_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi64_rpl(vF, _mm256_add_epi64(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 8);
            vFt = _mm256_add_epi64(vFt, vSegLenXgap);
            vF = _mm256_max_epi64_rpl(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 8);
        vF = _mm256_add_epi64(vF, vNegInfFront);
        vH = _mm256_max_epi64_rpl(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vF, vGapE),
                    _mm256_sub_epi64(vH, vGapO));
            vH = _mm256_max_epi64_rpl(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m256i vCompare;
            vH = _mm256_load_si256(pvH + offset);
            vCompare = _mm256_and_si256(vPosMask, _mm256_cmpgt_epi64(vH, vMaxH));
            vMaxH = _mm256_max_epi64_rpl(vH, vMaxH);
            if (_mm256_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        }
        score = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 8);
            }
            score = (int64_t) _mm256_extract_epi64_rpl (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}